

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

boolean use_merged_upsample(j_decompress_ptr cinfo)

{
  j_decompress_ptr cinfo_local;
  boolean local_4;
  
  if ((cinfo->do_fancy_upsampling == 0) && (cinfo->CCIR601_sampling == 0)) {
    if (((cinfo->jpeg_color_space == JCS_YCbCr) && (cinfo->num_components == 3)) &&
       ((((((cinfo->out_color_space == JCS_RGB || (cinfo->out_color_space == JCS_RGB565)) ||
           (cinfo->out_color_space == JCS_EXT_RGB)) ||
          (((cinfo->out_color_space == JCS_EXT_RGBX || (cinfo->out_color_space == JCS_EXT_BGR)) ||
           (cinfo->out_color_space == JCS_EXT_BGRX)))) ||
         ((cinfo->out_color_space == JCS_EXT_XBGR || (cinfo->out_color_space == JCS_EXT_XRGB)))) ||
        ((cinfo->out_color_space == JCS_EXT_RGBA ||
         (((cinfo->out_color_space == JCS_EXT_BGRA || (cinfo->out_color_space == JCS_EXT_ABGR)) ||
          (cinfo->out_color_space == JCS_EXT_ARGB)))))))) {
      if (((cinfo->out_color_space == JCS_RGB565) && (cinfo->out_color_components != 3)) ||
         ((cinfo->out_color_space != JCS_RGB565 &&
          (cinfo->out_color_components != rgb_pixelsize[cinfo->out_color_space])))) {
        local_4 = 0;
      }
      else if (((cinfo->comp_info->h_samp_factor == 2) && (cinfo->comp_info[1].h_samp_factor == 1))
              && ((cinfo->comp_info[2].h_samp_factor == 1 &&
                  (((cinfo->comp_info->v_samp_factor < 3 && (cinfo->comp_info[1].v_samp_factor == 1)
                    ) && (cinfo->comp_info[2].v_samp_factor == 1)))))) {
        if (((cinfo->comp_info->DCT_scaled_size == cinfo->min_DCT_scaled_size) &&
            (cinfo->comp_info[1].DCT_scaled_size == cinfo->min_DCT_scaled_size)) &&
           (cinfo->comp_info[2].DCT_scaled_size == cinfo->min_DCT_scaled_size)) {
          local_4 = 1;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LOCAL(boolean)
use_merged_upsample(j_decompress_ptr cinfo)
{
#ifdef UPSAMPLE_MERGING_SUPPORTED
  /* Merging is the equivalent of plain box-filter upsampling */
  if (cinfo->do_fancy_upsampling || cinfo->CCIR601_sampling)
    return FALSE;
  /* jdmerge.c only supports YCC=>RGB and YCC=>RGB565 color conversion */
  if (cinfo->jpeg_color_space != JCS_YCbCr || cinfo->num_components != 3 ||
      (cinfo->out_color_space != JCS_RGB &&
       cinfo->out_color_space != JCS_RGB565 &&
       cinfo->out_color_space != JCS_EXT_RGB &&
       cinfo->out_color_space != JCS_EXT_RGBX &&
       cinfo->out_color_space != JCS_EXT_BGR &&
       cinfo->out_color_space != JCS_EXT_BGRX &&
       cinfo->out_color_space != JCS_EXT_XBGR &&
       cinfo->out_color_space != JCS_EXT_XRGB &&
       cinfo->out_color_space != JCS_EXT_RGBA &&
       cinfo->out_color_space != JCS_EXT_BGRA &&
       cinfo->out_color_space != JCS_EXT_ABGR &&
       cinfo->out_color_space != JCS_EXT_ARGB))
    return FALSE;
  if ((cinfo->out_color_space == JCS_RGB565 &&
       cinfo->out_color_components != 3) ||
      (cinfo->out_color_space != JCS_RGB565 &&
       cinfo->out_color_components != rgb_pixelsize[cinfo->out_color_space]))
    return FALSE;
  /* and it only handles 2h1v or 2h2v sampling ratios */
  if (cinfo->comp_info[0].h_samp_factor != 2 ||
      cinfo->comp_info[1].h_samp_factor != 1 ||
      cinfo->comp_info[2].h_samp_factor != 1 ||
      cinfo->comp_info[0].v_samp_factor >  2 ||
      cinfo->comp_info[1].v_samp_factor != 1 ||
      cinfo->comp_info[2].v_samp_factor != 1)
    return FALSE;
  /* furthermore, it doesn't work if we've scaled the IDCTs differently */
  if (cinfo->comp_info[0]._DCT_scaled_size != cinfo->_min_DCT_scaled_size ||
      cinfo->comp_info[1]._DCT_scaled_size != cinfo->_min_DCT_scaled_size ||
      cinfo->comp_info[2]._DCT_scaled_size != cinfo->_min_DCT_scaled_size)
    return FALSE;
  /* ??? also need to test for upsample-time rescaling, when & if supported */
  return TRUE;                  /* by golly, it'll work... */
#else
  return FALSE;
#endif
}